

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

Uint32 GPU_LinkManyShaders(Uint32 *shader_objects,int count)

{
  _Bool _Var1;
  int local_24;
  int i;
  Uint32 p;
  int count_local;
  Uint32 *shader_objects_local;
  
  if ((_gpu_current_renderer == (GPU_Renderer *)0x0) ||
     (_gpu_current_renderer->current_context_target == (GPU_Target *)0x0)) {
    shader_objects_local._4_4_ = 0;
  }
  else if ((_gpu_current_renderer->enabled_features & 0x300) == 0x300) {
    shader_objects_local._4_4_ =
         (*_gpu_current_renderer->impl->CreateShaderProgram)(_gpu_current_renderer);
    for (local_24 = 0; local_24 < count; local_24 = local_24 + 1) {
      (*_gpu_current_renderer->impl->AttachShader)
                (_gpu_current_renderer,shader_objects_local._4_4_,shader_objects[local_24]);
    }
    _Var1 = (*_gpu_current_renderer->impl->LinkShaderProgram)
                      (_gpu_current_renderer,shader_objects_local._4_4_);
    if (!_Var1) {
      (*_gpu_current_renderer->impl->FreeShaderProgram)
                (_gpu_current_renderer,shader_objects_local._4_4_);
      shader_objects_local._4_4_ = 0;
    }
  }
  else {
    shader_objects_local._4_4_ = 0;
  }
  return shader_objects_local._4_4_;
}

Assistant:

Uint32 GPU_LinkManyShaders(Uint32 *shader_objects, int count)
{
    Uint32 p;
    int i;

    if(_gpu_current_renderer == NULL || _gpu_current_renderer->current_context_target == NULL)
        return 0;

    if((_gpu_current_renderer->enabled_features & GPU_FEATURE_BASIC_SHADERS) != GPU_FEATURE_BASIC_SHADERS)
        return 0;

    p = _gpu_current_renderer->impl->CreateShaderProgram(_gpu_current_renderer);

    for (i = 0; i < count; i++)
        _gpu_current_renderer->impl->AttachShader(_gpu_current_renderer, p, shader_objects[i]);

    if(_gpu_current_renderer->impl->LinkShaderProgram(_gpu_current_renderer, p))
        return p;

    _gpu_current_renderer->impl->FreeShaderProgram(_gpu_current_renderer, p);
    return 0;
}